

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFExc.cc
# Opt level: O1

void __thiscall
QPDFExc::QPDFExc(QPDFExc *this,qpdf_error_code_e error_code,string *filename,string *object,
                qpdf_offset_t offset,string *message,bool zero_offset_valid)

{
  pointer pcVar1;
  string *object_00;
  string local_50;
  
  object_00 = (string *)0xffffffffffffffff;
  if (zero_offset_valid) {
    object_00 = (string *)offset;
  }
  if (offset != 0) {
    object_00 = (string *)offset;
  }
  createWhat(&local_50,(QPDFExc *)filename,object,object_00,(qpdf_offset_t)message,message);
  std::runtime_error::runtime_error(&this->super_runtime_error,(string *)&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  *(undefined ***)this = &PTR__QPDFExc_002eddb8;
  this->error_code = error_code;
  (this->filename)._M_dataplus._M_p = (pointer)&(this->filename).field_2;
  pcVar1 = (filename->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->filename,pcVar1,pcVar1 + filename->_M_string_length);
  (this->object)._M_dataplus._M_p = (pointer)&(this->object).field_2;
  pcVar1 = (object->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->object,pcVar1,pcVar1 + object->_M_string_length);
  this->offset = (qpdf_offset_t)object_00;
  (this->message)._M_dataplus._M_p = (pointer)&(this->message).field_2;
  pcVar1 = (message->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->message,pcVar1,pcVar1 + message->_M_string_length);
  return;
}

Assistant:

QPDFExc::QPDFExc(
    qpdf_error_code_e error_code,
    std::string const& filename,
    std::string const& object,
    qpdf_offset_t offset,
    std::string const& message,
    bool zero_offset_valid) :
    std::runtime_error(
        createWhat(filename, object, (offset || zero_offset_valid ? offset : -1), message)),
    error_code(error_code),
    filename(filename),
    object(object),
    offset(offset || zero_offset_valid ? offset : -1),
    message(message)
{
}